

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusion.cpp
# Opt level: O1

void __thiscall RTFusion::RTFusion(RTFusion *this)

{
  this->_vptr_RTFusion = (_func_int **)&PTR__RTFusion_0012a418;
  RTVector3::RTVector3(&this->m_gyro);
  RTVector3::RTVector3(&this->m_accel);
  RTVector3::RTVector3(&this->m_compass);
  RTQuaternion::RTQuaternion(&this->m_measuredQPose);
  RTVector3::RTVector3(&this->m_measuredPose);
  RTQuaternion::RTQuaternion(&this->m_fusionQPose);
  RTVector3::RTVector3(&this->m_fusionPose);
  RTQuaternion::RTQuaternion(&this->m_gravity);
  RTQuaternion::RTQuaternion(&this->m_rotationDelta);
  RTQuaternion::RTQuaternion(&this->m_rotationPower);
  RTVector3::RTVector3(&this->m_rotationUnitVector);
  this->m_debug = false;
  this->m_enableGyro = true;
  this->m_enableAccel = true;
  this->m_enableCompass = true;
  this->m_firstTime = true;
  (this->m_gravity).m_data[0] = 0.0;
  (this->m_gravity).m_data[1] = 0.0;
  (this->m_gravity).m_data[2] = 0.0;
  (this->m_gravity).m_data[3] = 1.0;
  this->m_slerpPower = 0.02;
  return;
}

Assistant:

RTFusion::RTFusion()
{
    m_debug = false;
    m_firstTime = true;
    m_enableGyro = true;
    m_enableAccel = true;
    m_enableCompass = true;

    m_gravity.setScalar(0);
    m_gravity.setX(0);
    m_gravity.setY(0);
    m_gravity.setZ(1);

    m_slerpPower = RTQF_SLERP_POWER;
}